

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

bool Validator::nurseWorkingHalfWeekEnd(NurseSolution *nurse)

{
  int iVar1;
  vector<Turn_*,_std::allocator<Turn_*>_> *__x;
  bool bVar2;
  vector<Turn_*,_std::allocator<Turn_*>_> turns;
  _Vector_base<Turn_*,_std::allocator<Turn_*>_> local_20;
  
  __x = NurseSolution::getTurns(nurse);
  std::vector<Turn_*,_std::allocator<Turn_*>_>::vector
            ((vector<Turn_*,_std::allocator<Turn_*>_> *)&local_20,__x);
  if (8 < (ulong)((long)local_20._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_20._M_impl.super__Vector_impl_data._M_start)) {
    iVar1 = Turn::getDay(*(Turn **)((long)local_20._M_impl.super__Vector_impl_data._M_start +
                                   (((long)local_20._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_20._M_impl.super__Vector_impl_data._M_start) - 8U)))
    ;
    if (iVar1 == 6) {
      iVar1 = Turn::getDay(local_20._M_impl.super__Vector_impl_data._M_finish[-2]);
      bVar2 = true;
      if (iVar1 != 5) goto LAB_00111db1;
    }
    iVar1 = Turn::getDay(local_20._M_impl.super__Vector_impl_data._M_finish[-1]);
    bVar2 = true;
    if (iVar1 == 5) goto LAB_00111db1;
  }
  bVar2 = false;
LAB_00111db1:
  std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base(&local_20);
  return bVar2;
}

Assistant:

bool Validator::nurseWorkingHalfWeekEnd(NurseSolution *nurse){

    vector<Turn *> turns = nurse->getTurns();

    if(turns.size() > 1)
    {
        if(turns[turns.size() - 1]->getDay() == 6)
            if(turns[turns.size() - 2]->getDay() != 5)
                return true;
        if(turns[turns.size() - 1]->getDay() == 5)
            return true;
    }

    return false;
}